

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-oob.c
# Opt level: O1

void poll_cb(uv_poll_t *handle,int status,int events)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  char buffer [5];
  int fd;
  int local_2c;
  char local_28;
  int local_24;
  
  iVar1 = uv_fileno(handle,&stack0xffffffffffffffdc);
  if (iVar1 == 0) {
    local_28 = '\0';
    local_2c = 0;
    if ((events & 8U) != 0) {
      do {
        handle = (uv_poll_t *)(ulong)(uint)client_fd;
        sVar3 = recv(client_fd,&stack0xffffffffffffffd4,5,1);
        if ((int)sVar3 != -1) break;
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
      if ((-1 < (int)sVar3) || (piVar4 = __errno_location(), *piVar4 != 0x16)) {
        cli_pr_check = 1;
        handle = poll_req;
        iVar1 = uv_poll_stop(poll_req);
        if (iVar1 != 0) goto LAB_00167526;
        handle = poll_req;
        iVar1 = uv_poll_start(poll_req,3,poll_cb);
        if (iVar1 == 0) goto LAB_00167325;
        goto LAB_0016752b;
      }
      goto LAB_0016753f;
    }
LAB_00167325:
    if ((events & 1U) == 0) goto LAB_001674d8;
    if (local_24 != client_fd) goto LAB_00167459;
    do {
      handle = (uv_poll_t *)(ulong)(uint)client_fd;
      sVar3 = recv(client_fd,&stack0xffffffffffffffd4,5,0);
      iVar1 = (int)sVar3;
      if (iVar1 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    if ((iVar1 < 0) && (piVar4 = __errno_location(), *piVar4 == 0x16)) goto LAB_0016754e;
    if (cli_rd_check == 1) {
      handle = (uv_poll_t *)&stack0xffffffffffffffd4;
      iVar2 = strncmp((char *)handle,"world",(long)iVar1);
      if (iVar2 != 0) goto LAB_00167544;
      if (iVar1 == 5) {
        cli_rd_check = 2;
        goto LAB_001673b7;
      }
      goto LAB_00167549;
    }
LAB_001673b7:
    if (cli_rd_check == 0) {
      if (iVar1 != 4) goto LAB_00167553;
      if (local_2c == 0x6c6c6568) {
        iVar1 = 1;
LAB_001673f1:
        do {
          cli_rd_check = iVar1;
          handle = (uv_poll_t *)(ulong)(uint)server_fd;
          sVar3 = recv(server_fd,&stack0xffffffffffffffd4,5,0);
          iVar2 = (int)sVar3;
          if (iVar2 == -1) {
            piVar4 = __errno_location();
            iVar1 = cli_rd_check;
            if (*piVar4 == 4) goto LAB_001673f1;
          }
          if (iVar2 < 1) goto LAB_00167444;
          if (iVar2 != 5) {
            poll_cb_cold_14();
            goto LAB_00167521;
          }
          iVar1 = 2;
        } while (local_28 == 'd' && local_2c == 0x6c726f77);
        poll_cb_cold_15();
LAB_00167444:
        piVar4 = __errno_location();
        if ((*piVar4 != 0xb) && (*piVar4 != 0x73)) goto LAB_00167562;
        goto LAB_00167459;
      }
      goto LAB_00167558;
    }
LAB_00167459:
    if (local_24 != server_fd) {
LAB_001674d8:
      if ((events & 2U) == 0) {
        return;
      }
      do {
        handle = (uv_poll_t *)(ulong)(uint)client_fd;
        sVar3 = send(client_fd,"foo",3,0);
        if (-1 < (int)sVar3) break;
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
      if ((int)sVar3 == 3) {
        return;
      }
      goto LAB_00167530;
    }
    do {
      handle = (uv_poll_t *)(ulong)(uint)server_fd;
      sVar3 = recv(server_fd,&stack0xffffffffffffffd4,3,0);
      iVar1 = (int)sVar3;
      if (iVar1 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    if ((-1 < iVar1) || (piVar4 = __errno_location(), *piVar4 != 0x16)) {
      if (iVar1 != 3) goto LAB_00167535;
      if (local_2c._2_1_ == 'o' && (short)local_2c == 0x6f66) {
        srv_rd_check = 1;
        uv_poll_stop(0x3108d0);
        goto LAB_001674d8;
      }
      goto LAB_0016753a;
    }
  }
  else {
LAB_00167521:
    poll_cb_cold_1();
LAB_00167526:
    poll_cb_cold_3();
LAB_0016752b:
    poll_cb_cold_4();
LAB_00167530:
    poll_cb_cold_16();
LAB_00167535:
    poll_cb_cold_11();
LAB_0016753a:
    poll_cb_cold_12();
LAB_0016753f:
    poll_cb_cold_2();
LAB_00167544:
    poll_cb_cold_6();
LAB_00167549:
    poll_cb_cold_7();
LAB_0016754e:
    poll_cb_cold_5();
LAB_00167553:
    poll_cb_cold_8();
LAB_00167558:
    poll_cb_cold_9();
  }
  poll_cb_cold_10();
LAB_00167562:
  poll_cb_cold_13();
  uv_sleep(100);
  iVar1 = ticks;
  ticks = ticks + 1;
  if (iVar1 < 9) {
    return;
  }
  uv_poll_stop(poll_req);
  uv_poll_stop(0x3108d0);
  uv_close(&server_handle,0);
  uv_close(&client_handle,0);
  uv_close(&peer_handle,0);
  uv_close(handle,0);
  return;
}

Assistant:

static void poll_cb(uv_poll_t* handle, int status, int events) {
  char buffer[5];
  int n;
  int fd;

  ASSERT(0 == uv_fileno((uv_handle_t*)handle, &fd));
  memset(buffer, 0, 5);

  if (events & UV_PRIORITIZED) {
    do
      n = recv(client_fd, &buffer, 5, MSG_OOB);
    while (n == -1 && errno == EINTR);
    ASSERT(n >= 0 || errno != EINVAL);
    cli_pr_check = 1;
    ASSERT(0 == uv_poll_stop(&poll_req[0]));
    ASSERT(0 == uv_poll_start(&poll_req[0],
                              UV_READABLE | UV_WRITABLE,
                              poll_cb));
  }
  if (events & UV_READABLE) {
    if (fd == client_fd) {
      do
        n = recv(client_fd, &buffer, 5, 0);
      while (n == -1 && errno == EINTR);
      ASSERT(n >= 0 || errno != EINVAL);
      if (cli_rd_check == 1) {
        ASSERT(strncmp(buffer, "world", n) == 0);
        ASSERT(5 == n);
        cli_rd_check = 2;
      }
      if (cli_rd_check == 0) {
        ASSERT(n == 4);
        ASSERT(strncmp(buffer, "hello", n) == 0);
        cli_rd_check = 1;
        do {
          do
            n = recv(server_fd, &buffer, 5, 0);
          while (n == -1 && errno == EINTR);
          if (n > 0) {
            ASSERT(n == 5);
            ASSERT(strncmp(buffer, "world", n) == 0);
            cli_rd_check = 2;
          }
        } while (n > 0);

        ASSERT(got_eagain());
      }
    }
    if (fd == server_fd) {
      do
        n = recv(server_fd, &buffer, 3, 0);
      while (n == -1 && errno == EINTR);
      ASSERT(n >= 0 || errno != EINVAL);
      ASSERT(3 == n);
      ASSERT(strncmp(buffer, "foo", n) == 0);
      srv_rd_check = 1;
      uv_poll_stop(&poll_req[1]);
    }
  }
  if (events & UV_WRITABLE) {
    do {
      n = send(client_fd, "foo", 3, 0);
    } while (n < 0 && errno == EINTR);
    ASSERT(3 == n);
  }
}